

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_metrics.hpp
# Opt level: O0

double __thiscall
notch::metrics::ConfusionMatrix<int,_1>::precision(ConfusionMatrix<int,_1> *this,int class_)

{
  bool bVar1;
  reference ppVar2;
  int count;
  int predicted;
  int actual;
  pair<const_std::pair<int,_int>,_int> p;
  iterator __end0;
  iterator __begin0;
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  *__range3;
  int local_18;
  int hypothesis_true_results;
  int hypothesis_total_results;
  int class__local;
  ConfusionMatrix<int,_1> *this_local;
  
  local_18 = 0;
  __range3._4_4_ = 0;
  __end0 = core::std::
           map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
           ::begin(&this->cm);
  p._4_8_ = core::std::
            map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
            ::end(&this->cm);
  while (bVar1 = core::std::operator!=(&__end0,(_Self *)&p.first.second), bVar1) {
    ppVar2 = core::std::_Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_int>_>::operator*
                       (&__end0);
    p.first.first = ppVar2->second;
    predicted = (ppVar2->first).first;
    actual = (ppVar2->first).second;
    if ((actual == class_) && (local_18 = p.first.first + local_18, actual == predicted)) {
      __range3._4_4_ = p.first.first + __range3._4_4_;
    }
    core::std::_Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_int>_>::operator++(&__end0);
  }
  return ((double)__range3._4_4_ * 1.0) / (double)local_18;
}

Assistant:

double precision(C class_) {
        int hypothesis_total_results = 0;
        int hypothesis_true_results = 0;
        for (auto p : cm) {
            auto actual = p.first.first;
            auto predicted = p.first.second;
            auto count = p.second;
            if (predicted == class_) {
                hypothesis_total_results += count;
                if (predicted == actual) {
                    hypothesis_true_results += count;
                }
            }
        }
        return 1.0 * hypothesis_true_results / hypothesis_total_results;
    }